

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O1

void __thiscall
cmFindBase::cmFindBase(cmFindBase *this,string *findCommandName,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  cmFindCommon::cmFindCommon(&this->super_cmFindCommon,status);
  this->_vptr_cmFindBase = (_func_int **)&PTR__cmFindBase_009beb18;
  paVar2 = &(this->FindCommandName).field_2;
  (this->FindCommandName)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (findCommandName->_M_dataplus)._M_p;
  paVar1 = &findCommandName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&findCommandName->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->FindCommandName).field_2 + 8) = uVar4;
  }
  else {
    (this->FindCommandName)._M_dataplus._M_p = pcVar3;
    (this->FindCommandName).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->FindCommandName)._M_string_length = findCommandName->_M_string_length;
  (findCommandName->_M_dataplus)._M_p = (pointer)paVar1;
  findCommandName->_M_string_length = 0;
  (findCommandName->field_2)._M_local_buf[0] = '\0';
  (this->VariableDocumentation)._M_dataplus._M_p = (pointer)&(this->VariableDocumentation).field_2;
  (this->VariableDocumentation)._M_string_length = 0;
  (this->VariableDocumentation).field_2._M_local_buf[0] = '\0';
  this->VariableType = UNINITIALIZED;
  (this->VariableName)._M_dataplus._M_p = (pointer)&(this->VariableName).field_2;
  (this->VariableName)._M_string_length = 0;
  (this->VariableName).field_2._M_local_buf[0] = '\0';
  (this->Names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->Names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->Names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (this->EnvironmentPath)._M_dataplus._M_p = (pointer)&(this->EnvironmentPath).field_2;
  (this->EnvironmentPath)._M_string_length = 0;
  (this->EnvironmentPath).field_2._M_local_buf[0] = '\0';
  this->AlreadyDefined = false;
  this->AlreadyInCacheWithoutMetaInfo = false;
  this->StoreResultInCache = true;
  this->Required = false;
  (this->ValidatorName)._M_dataplus._M_p = (pointer)&(this->ValidatorName).field_2;
  (this->ValidatorName)._M_string_length = 0;
  (this->ValidatorName).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

cmFindBase::cmFindBase(std::string findCommandName, cmExecutionStatus& status)
  : cmFindCommon(status)
  , FindCommandName(std::move(findCommandName))
{
}